

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

UBool __thiscall
icu_63::ReorderingBuffer::appendBMP(ReorderingBuffer *this,UChar c,uint8_t cc,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UBool UVar2;
  UErrorCode *errorCode_local;
  uint8_t cc_local;
  UChar c_local;
  ReorderingBuffer *this_local;
  
  if ((this->remainingCapacity == 0) && (UVar2 = resize(this,1,errorCode), UVar2 == '\0')) {
    this_local._7_1_ = '\0';
  }
  else {
    if ((cc < this->lastCC) && (cc != '\0')) {
      insert(this,(uint)(ushort)c,cc);
    }
    else {
      pUVar1 = this->limit;
      this->limit = pUVar1 + 1;
      *pUVar1 = c;
      this->lastCC = cc;
      if (cc < 2) {
        this->reorderStart = this->limit;
      }
    }
    this->remainingCapacity = this->remainingCapacity + -1;
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool appendBMP(UChar c, uint8_t cc, UErrorCode &errorCode) {
        if(remainingCapacity==0 && !resize(1, errorCode)) {
            return FALSE;
        }
        if(lastCC<=cc || cc==0) {
            *limit++=c;
            lastCC=cc;
            if(cc<=1) {
                reorderStart=limit;
            }
        } else {
            insert(c, cc);
        }
        --remainingCapacity;
        return TRUE;
    }